

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_immutable_samplers
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *samplers,
          VkSampler **out_sampler)

{
  VkSampler_T *pVVar1;
  DatabaseInterface *resolver_00;
  bool bVar2;
  SizeType SVar3;
  int iVar4;
  VkSampler_T **ppVVar5;
  ValueIterator this_00;
  ValueIterator pGVar6;
  Ch *str;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false> _Var7;
  uint64_t sampler_hash;
  allocator_type local_89;
  DatabaseInterface *local_88;
  size_t external_state_size;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_78;
  VkSampler_T **local_70;
  VkSampler **local_68;
  Impl *local_60;
  VkSampler_T **local_58;
  Value *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  
  local_88 = resolver;
  local_68 = out_sampler;
  SVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(samplers);
  ppVVar5 = ScratchAllocator::allocate_n<VkSampler_T*>(&this->allocator,(ulong)SVar3);
  local_50 = samplers;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Begin(samplers);
  resolver_00 = local_88;
  local_78 = &(this->replayed_samplers)._M_h;
  local_70 = ppVVar5;
  local_60 = this;
  do {
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(local_50);
    if (this_00 == pGVar6) {
      *local_68 = local_70;
LAB_00116e32:
      return this_00 == pGVar6;
    }
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(this_00);
    sampler_hash = string_to_uint64(str);
    if (sampler_hash != 0) {
      _Var7._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(local_78,&sampler_hash);
      if (_Var7._M_cur == (__node_type *)0x0) {
        external_state_size = 0;
        if (local_88 != (DatabaseInterface *)0x0) {
          iVar4 = (*local_88->_vptr_DatabaseInterface[3])
                            (local_88,1,sampler_hash,&external_state_size,0,0);
          if ((char)iVar4 != '\0') {
            local_58 = ppVVar5;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&external_state,external_state_size,&local_89);
            iVar4 = (*resolver_00->_vptr_DatabaseInterface[3])
                              (resolver_00,1,sampler_hash,&external_state_size,
                               external_state.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            if ((char)iVar4 == '\0') {
              log_missing_resource("Immutable sampler",sampler_hash);
            }
            else {
              bVar2 = parse(local_60,iface,resolver_00,
                            external_state.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)external_state.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)external_state.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              if (bVar2) {
                (**(code **)(*(long *)iface + 0x80))(iface);
                _Var7._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find(local_78,&sampler_hash);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          (&external_state.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                ppVVar5 = local_58;
                if (_Var7._M_cur != (__node_type *)0x0) goto LAB_00116dcc;
                goto LAB_00116df4;
              }
            }
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&external_state.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            goto LAB_00116e32;
          }
        }
LAB_00116df4:
        log_missing_resource("Immutable sampler",sampler_hash);
        goto LAB_00116e32;
      }
      (**(code **)(*(long *)iface + 0x80))(iface);
LAB_00116dcc:
      pVVar1 = *(VkSampler_T **)
                ((long)&((_Var7._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_long,_VkSampler_T_*>_>.
                        _M_storage._M_storage + 8);
      if (pVVar1 == (VkSampler_T *)0x0) {
        log_invalid_resource("Immutable sampler",sampler_hash);
        goto LAB_00116e32;
      }
      *ppVVar5 = pVVar1;
    }
    this_00 = this_00 + 1;
    ppVVar5 = ppVVar5 + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_immutable_samplers(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                   const Value &samplers, const VkSampler **out_sampler)
{
	auto *samps = allocator.allocate_n<VkSampler>(samplers.Size());
	auto *ret = samps;
	for (auto itr = samplers.Begin(); itr != samplers.End(); ++itr, samps++)
	{
		auto sampler_hash = string_to_uint64(itr->GetString());
		if (sampler_hash > 0)
		{
			auto sampler_itr = replayed_samplers.find(sampler_hash);
			if (sampler_itr == end(replayed_samplers))
			{
				size_t external_state_size = 0;
				if (!resolver || !resolver->read_entry(RESOURCE_SAMPLER, sampler_hash,
				                                       &external_state_size, nullptr,
				                                       PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Immutable sampler", sampler_hash);
					return false;
				}

				vector<uint8_t> external_state(external_state_size);

				if (!resolver->read_entry(RESOURCE_SAMPLER, sampler_hash,
				                          &external_state_size, external_state.data(),
				                          PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Immutable sampler", sampler_hash);
					return false;
				}

				if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
					return false;

				iface.sync_samplers();
				sampler_itr = replayed_samplers.find(sampler_hash);
			}
			else
				iface.sync_samplers();

			if (sampler_itr == replayed_samplers.end())
			{
				log_missing_resource("Immutable sampler", sampler_hash);
				return false;
			}
			else if (sampler_itr->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Immutable sampler", sampler_hash);
				return false;
			}

			*samps = sampler_itr->second;
		}
	}

	*out_sampler = ret;
	return true;
}